

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderSubroutineTests.cpp
# Opt level: O3

void __thiscall
gl4cts::ShaderSubroutine::FunctionalTest7_8::logError
          (FunctionalTest7_8 *this,GLuint *combination,vec4<float> *left,vec4<float> *right,
          vec4<unsigned_int> *indices,vec4<float> *vec4_expected,vec4<float> *vec4_result,
          GLuint array_length,bool *result)

{
  ostringstream *this_00;
  short sVar1;
  short sVar2;
  short sVar3;
  short sVar4;
  short sVar5;
  short sVar6;
  short sVar7;
  short sVar8;
  char cVar9;
  char cVar10;
  undefined1 auVar11 [15];
  undefined1 auVar12 [15];
  undefined1 auVar13 [15];
  undefined1 auVar14 [15];
  undefined1 auVar15 [15];
  undefined1 auVar16 [15];
  ushort uVar17;
  ushort uVar18;
  undefined1 auVar19 [15];
  undefined1 auVar20 [15];
  undefined1 auVar21 [15];
  undefined1 auVar22 [15];
  undefined3 uVar23;
  undefined3 uVar24;
  undefined1 auVar25 [15];
  undefined1 auVar26 [15];
  uint uVar27;
  uint uVar28;
  undefined5 uVar29;
  undefined5 uVar30;
  undefined1 auVar31 [12];
  undefined1 auVar32 [12];
  undefined1 auVar33 [14];
  undefined1 auVar34 [14];
  ulong uVar35;
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  GLchar functions [4];
  GLchar functions_inverted [4];
  MessageBuilder message;
  vec4<float> dynamic_values [5];
  undefined1 local_3d8 [120];
  ios_base local_360 [264];
  undefined8 local_258;
  undefined8 uStack_250;
  undefined8 local_248;
  undefined8 uStack_240;
  undefined8 local_238;
  undefined8 uStack_230;
  undefined8 local_228;
  undefined8 uStack_220;
  undefined8 local_218;
  undefined8 uStack_210;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  
  auVar36._0_4_ = -(uint)(*combination == 0);
  auVar36._4_4_ = -(uint)(combination[1] == 0);
  auVar36._8_4_ = -(uint)(combination[2] == 0);
  auVar36._12_4_ = -(uint)(combination[3] == 0);
  auVar36 = packssdw(auVar36,auVar36);
  auVar36 = packsswb(auVar36,auVar36);
  auVar40[0] = 0x2a - auVar36[0];
  cVar9 = -auVar36[7];
  uVar17 = CONCAT11(-auVar36[8],cVar9);
  uVar23 = CONCAT12(-auVar36[9],uVar17);
  uVar27 = CONCAT13(-auVar36[10],uVar23);
  uVar29 = CONCAT14(-auVar36[0xb],uVar27);
  auVar33[5] = -auVar36[0xc];
  auVar33._0_5_ = uVar29;
  auVar38._0_4_ = -(uint)(combination[indices->m_x] == 0);
  auVar38._4_4_ = -(uint)(combination[indices->m_y] == 0);
  auVar38._8_4_ = -(uint)(combination[indices->m_z] == 0);
  auVar38._12_4_ = -(uint)(combination[indices->m_w] == 0);
  auVar37 = packssdw(auVar38,auVar38);
  auVar38 = packsswb(auVar37,auVar37);
  auVar39[0] = 0x2a - auVar38[0];
  cVar10 = -auVar38[7];
  uVar18 = CONCAT11(-auVar38[8],cVar10);
  uVar24 = CONCAT12(-auVar38[9],uVar18);
  uVar28 = CONCAT13(-auVar38[10],uVar24);
  uVar30 = CONCAT14(-auVar38[0xb],uVar28);
  auVar34[5] = -auVar38[0xc];
  auVar34._0_5_ = uVar30;
  auVar33._6_8_ = 0;
  auVar11[0xe] = cVar9;
  auVar11._0_14_ = auVar33 << 0x38;
  auVar31._4_8_ = 0;
  auVar31._0_4_ = uVar27;
  auVar13._12_3_ = (int3)(CONCAT26(auVar11._13_2_,CONCAT15(-auVar36[6],uVar29)) >> 0x28);
  auVar13._0_12_ = auVar31 << 0x38;
  auVar15._10_5_ = (int5)(CONCAT44(auVar13._11_4_,CONCAT13(-auVar36[5],uVar23)) >> 0x18);
  auVar15._0_10_ = (unkuint10)uVar17 << 0x38;
  auVar19._7_8_ = 0;
  auVar19._0_7_ = (uint7)(CONCAT62(auVar15._9_6_,CONCAT11(-auVar36[4],cVar9)) >> 8);
  auVar25._1_8_ = SUB158(auVar19 << 0x40,7);
  auVar25[0] = '*' - auVar36[3];
  auVar25._9_6_ = 0;
  auVar20._1_10_ = SUB1510(auVar25 << 0x30,5);
  auVar20[0] = '*' - auVar36[2];
  auVar20._11_4_ = 0;
  auVar40._3_12_ = SUB1512(auVar20 << 0x20,3);
  auVar40[2] = '*' - auVar36[1];
  auVar40[1] = 0;
  auVar40[0xf] = 0;
  auVar36 = pshuflw(auVar36,auVar40,0x1b);
  sVar1 = auVar36._0_2_;
  sVar2 = auVar36._2_2_;
  auVar37[1] = (0 < sVar2) * (sVar2 < 0x100) * auVar36[2] - (0xff < sVar2);
  auVar37[0] = (0 < sVar1) * (sVar1 < 0x100) * auVar36[0] - (0xff < sVar1);
  sVar3 = auVar36._4_2_;
  auVar37[2] = (0 < sVar3) * (sVar3 < 0x100) * auVar36[4] - (0xff < sVar3);
  sVar4 = auVar36._6_2_;
  auVar37[3] = (0 < sVar4) * (sVar4 < 0x100) * auVar36[6] - (0xff < sVar4);
  sVar5 = auVar36._8_2_;
  auVar37[4] = (0 < sVar5) * (sVar5 < 0x100) * auVar36[8] - (0xff < sVar5);
  sVar6 = auVar36._10_2_;
  auVar37[5] = (0 < sVar6) * (sVar6 < 0x100) * auVar36[10] - (0xff < sVar6);
  sVar7 = auVar36._12_2_;
  auVar37[6] = (0 < sVar7) * (sVar7 < 0x100) * auVar36[0xc] - (0xff < sVar7);
  sVar8 = auVar36._14_2_;
  auVar37[7] = (0 < sVar8) * (sVar8 < 0x100) * auVar36[0xe] - (0xff < sVar8);
  auVar37[8] = (0 < sVar1) * (sVar1 < 0x100) * auVar36[0] - (0xff < sVar1);
  auVar37[9] = (0 < sVar2) * (sVar2 < 0x100) * auVar36[2] - (0xff < sVar2);
  auVar37[10] = (0 < sVar3) * (sVar3 < 0x100) * auVar36[4] - (0xff < sVar3);
  auVar37[0xb] = (0 < sVar4) * (sVar4 < 0x100) * auVar36[6] - (0xff < sVar4);
  auVar37[0xc] = (0 < sVar5) * (sVar5 < 0x100) * auVar36[8] - (0xff < sVar5);
  auVar37[0xd] = (0 < sVar6) * (sVar6 < 0x100) * auVar36[10] - (0xff < sVar6);
  auVar37[0xe] = (0 < sVar7) * (sVar7 < 0x100) * auVar36[0xc] - (0xff < sVar7);
  auVar37[0xf] = (0 < sVar8) * (sVar8 < 0x100) * auVar36[0xe] - (0xff < sVar8);
  auVar34._6_8_ = 0;
  auVar12[0xe] = cVar10;
  auVar12._0_14_ = auVar34 << 0x38;
  auVar32._4_8_ = 0;
  auVar32._0_4_ = uVar28;
  auVar14._12_3_ = (int3)(CONCAT26(auVar12._13_2_,CONCAT15(-auVar38[6],uVar30)) >> 0x28);
  auVar14._0_12_ = auVar32 << 0x38;
  auVar16._10_5_ = (int5)(CONCAT44(auVar14._11_4_,CONCAT13(-auVar38[5],uVar24)) >> 0x18);
  auVar16._0_10_ = (unkuint10)uVar18 << 0x38;
  auVar21._7_8_ = 0;
  auVar21._0_7_ = (uint7)(CONCAT62(auVar16._9_6_,CONCAT11(-auVar38[4],cVar10)) >> 8);
  auVar26._1_8_ = SUB158(auVar21 << 0x40,7);
  auVar26[0] = '*' - auVar38[3];
  auVar26._9_6_ = 0;
  auVar22._1_10_ = SUB1510(auVar26 << 0x30,5);
  auVar22[0] = '*' - auVar38[2];
  auVar22._11_4_ = 0;
  auVar39._3_12_ = SUB1512(auVar22 << 0x20,3);
  auVar39[2] = '*' - auVar38[1];
  auVar39[1] = 0;
  auVar39[0xf] = 0;
  pshuflw(auVar37,auVar39,0x1b);
  local_88 = 0x400000003f800000;
  uStack_80 = 0x4080000040400000;
  local_78 = 0xc0c00000c0a00000;
  uStack_70 = 0xc1000000c0e00000;
  local_68 = 0xc0000000bf800000;
  uStack_60 = 0xc0800000c0400000;
  local_58 = 0x40c0000040a00000;
  uStack_50 = 0x4100000040e00000;
  local_48 = 0x400000003f800000;
  uStack_40 = 0x4080000040400000;
  local_258._0_4_ = left->m_x;
  local_258._4_4_ = left->m_y;
  uStack_250._0_4_ = left->m_z;
  uStack_250._4_4_ = left->m_w;
  local_248._0_4_ = right->m_x;
  local_248._4_4_ = right->m_y;
  uStack_240._0_4_ = right->m_z;
  uStack_240._4_4_ = right->m_w;
  local_238._0_4_ = right->m_x;
  local_238._4_4_ = right->m_y;
  uStack_230._0_4_ = right->m_z;
  uStack_230._4_4_ = right->m_w;
  local_228._0_4_ = right->m_x;
  local_228._4_4_ = right->m_y;
  uStack_220._0_4_ = right->m_z;
  uStack_220._4_4_ = right->m_w;
  local_218._0_4_ = right->m_x;
  local_218._4_4_ = right->m_y;
  uStack_210._0_4_ = right->m_z;
  uStack_210._4_4_ = right->m_w;
  this_00 = (ostringstream *)(local_3d8 + 8);
  uVar35 = 0;
  do {
    if (result[uVar35] == false) {
      (*(code *)((long)&DAT_01a5f7f0 + (long)(int)(&DAT_01a5f7f0)[uVar35 & 0xffffffff]))();
      return;
    }
    if (array_length != 4) {
      local_3d8._0_8_ = ((this->super_TestCase).m_context)->m_testCtx->m_log;
      std::__cxx11::ostringstream::ostringstream(this_00);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)this_00,"Error. Invalid array length: ",0x1d);
      std::ostream::_M_insert<unsigned_long>((ulong)this_00);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,". Expected 4.",0xd);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_3d8,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(this_00);
      std::ios_base::~ios_base(local_360);
    }
    uVar35 = uVar35 + 1;
  } while (uVar35 != 7);
  return;
}

Assistant:

void FunctionalTest7_8::logError(const glw::GLuint combination[4], const Utils::vec4<glw::GLfloat>& left,
								 const Utils::vec4<glw::GLfloat>& right, const Utils::vec4<glw::GLuint>& indices,
								 const Utils::vec4<glw::GLfloat> vec4_expected[7],
								 const Utils::vec4<glw::GLfloat> vec4_result[7], glw::GLuint array_length,
								 bool result[7]) const
{
	static const GLuint n_functions  = 4;
	static const GLuint n_operations = 7;

	/* Indices used by "dynamic" operations, range <0..4> */
	const GLuint dynamic_combination[4] = { combination[indices.m_x], combination[indices.m_y],
											combination[indices.m_z], combination[indices.m_w] };

	/* Function symbols */
	GLchar functions[4];
	GLchar functions_inverted[4];
	GLchar functions_dynamic[4];
	GLchar functions_dynamic_inverted[4];

	for (GLuint i = 0; i < n_functions; ++i)
	{
		GLchar function			= (0 == combination[i]) ? '+' : '*';
		GLchar dynamic_function = (0 == dynamic_combination[i]) ? '+' : '*';

		functions[i]									= function;
		functions_inverted[n_functions - i - 1]			= function;
		functions_dynamic[i]							= dynamic_function;
		functions_dynamic_inverted[n_functions - i - 1] = dynamic_function;
	}

	/* Values used by "constant" operations, come from shader code */
	const Utils::vec4<glw::GLfloat> constant_values[] = { Utils::vec4<glw::GLfloat>(1, 2, 3, 4),
														  Utils::vec4<glw::GLfloat>(-5, -6, -7, -8),
														  Utils::vec4<glw::GLfloat>(-1, -2, -3, -4),
														  Utils::vec4<glw::GLfloat>(5, 6, 7, 8),
														  Utils::vec4<glw::GLfloat>(1, 2, 3, 4) };

	/* Values used by non-"constant" operations */
	Utils::vec4<glw::GLfloat> dynamic_values[5];
	dynamic_values[0] = left;
	dynamic_values[1] = right;
	dynamic_values[2] = right;
	dynamic_values[3] = right;
	dynamic_values[4] = right;

	/* For each operation */
	for (GLuint i = 0; i < n_operations; ++i)
	{
		/* If result is failure */
		if (false == result[i])
		{
			const GLchar*					 description = 0;
			const Utils::vec4<glw::GLfloat>* input		 = 0;
			const GLchar*					 operation   = 0;

			switch (i)
			{
			case 0:
				description = "Call made with predefined array indices";
				input		= dynamic_values;
				operation   = functions;
				break;
			case 1:
				description = "Call made with predefined array indices in inverted order";
				input		= dynamic_values;
				operation   = functions_inverted;
				break;
			case 2:
				description = "Call made with predefined array indices, for constant values";
				input		= constant_values;
				operation   = functions;
				break;
			case 3:
				description = "Call made with predefined array indices in inverted order, for constant values";
				input		= constant_values;
				operation   = functions_inverted;
				break;
			case 4:
				description = "Call made with dynamic array indices";
				input		= dynamic_values;
				operation   = functions_dynamic;
				break;
			case 5:
				description = "Call made with dynamic array indices in inverted order";
				input		= dynamic_values;
				operation   = functions_dynamic_inverted;
				break;
			case 6:
				description = "Call made with loop";
				input		= dynamic_values;
				operation   = functions;
				break;
			}

			m_context.getTestContext().getLog() << tcu::TestLog::Message << "Error. Invalid result."
												<< tcu::TestLog::EndMessage;

			m_context.getTestContext().getLog() << tcu::TestLog::Message << description << tcu::TestLog::EndMessage;

			tcu::MessageBuilder message = m_context.getTestContext().getLog() << tcu::TestLog::Message;

			message << "Operation: ((((";
			input[0].log(message);
			for (GLuint function = 0; function < n_functions; ++function)
			{
				message << " " << operation[function] << " ";

				input[function + 1].log(message);

				message << ")";
			}

			message << tcu::TestLog::EndMessage;

			message = m_context.getTestContext().getLog() << tcu::TestLog::Message;

			message << "Result: ";
			vec4_result[i].log(message);

			message << tcu::TestLog::EndMessage;

			message = m_context.getTestContext().getLog() << tcu::TestLog::Message;

			message << "Expected: ";
			vec4_expected[i].log(message);

			message << tcu::TestLog::EndMessage;
		}

		/* Check array length, it should be 4 */
		if (4 != array_length)
		{
			m_context.getTestContext().getLog() << tcu::TestLog::Message
												<< "Error. Invalid array length: " << array_length << ". Expected 4."
												<< tcu::TestLog::EndMessage;
		}
	}
}